

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_int8.h
# Opt level: O0

void ncnn::convolution_int8
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_int8,int kernel_w,int kernel_h,
               int dilation_w,int dilation_h,int stride_w,int stride_h,Option *opt)

{
  int in_ECX;
  long *in_RDX;
  long *in_RSI;
  allocator_type *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  char w_1;
  char val;
  int k;
  char *sptr;
  Mat m_1;
  int q;
  char *kptr;
  int sum;
  int j_1;
  int i_1;
  int *outptr;
  int p;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outch;
  int outh;
  int outw;
  int channels;
  int w;
  Mat *m;
  Mat *m_2;
  allocator_type *in_stack_fffffffffffffd00;
  size_type in_stack_fffffffffffffd08;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd10;
  int local_2b4;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined4 local_290;
  long local_288;
  undefined4 local_280;
  undefined4 local_27c;
  undefined4 local_278;
  undefined4 local_274;
  undefined4 local_270;
  undefined8 local_268;
  int local_25c;
  long local_258;
  int local_24c;
  int local_248;
  int local_244;
  undefined8 local_240;
  undefined8 local_238;
  undefined8 local_230;
  undefined4 local_228;
  long local_220;
  undefined4 local_218;
  undefined4 local_214;
  undefined4 local_210;
  undefined4 local_20c;
  undefined4 local_208;
  undefined8 local_200;
  long local_1f8;
  int local_1f0;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  reference local_1d8;
  vector<int,_std::allocator<int>_> local_1b8;
  int local_19c;
  int local_198;
  int local_194;
  int local_190;
  int local_18c;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  long *local_178;
  long *local_170;
  allocator_type *local_168;
  undefined8 *local_160;
  undefined8 *local_158;
  undefined8 *local_148;
  undefined8 *local_138;
  undefined1 local_12d;
  int local_12c;
  undefined8 *local_120;
  undefined1 local_fd;
  int local_fc;
  allocator_type *local_f8;
  undefined8 *local_f0;
  long local_b0;
  undefined4 local_a4;
  long local_a0;
  long local_98;
  undefined4 local_8c;
  int local_88;
  int local_84;
  undefined8 *local_80;
  long local_78;
  undefined4 local_6c;
  long local_68;
  long local_60;
  undefined4 local_54;
  int local_50;
  int local_4c;
  undefined8 *local_48;
  undefined4 local_3c;
  long local_38;
  undefined4 local_2c;
  long local_28;
  long *local_20;
  undefined8 *local_18;
  int local_c;
  undefined8 *local_8;
  
  local_188 = *(int *)(in_RDI + 0x2c);
  local_18c = *(int *)(in_RDI + 0x38);
  local_190 = *(int *)((long)in_RSI + 0x2c);
  local_194 = (int)in_RSI[6];
  local_198 = (int)in_RSI[7];
  local_19c = in_ECX * in_R8D;
  local_184 = in_R9D;
  local_180 = in_R8D;
  local_17c = in_ECX;
  local_178 = in_RDX;
  local_170 = in_RSI;
  local_168 = in_RDI;
  std::allocator<int>::allocator((allocator<int> *)0x3fefc4);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  std::allocator<int>::~allocator((allocator<int> *)0x3fefea);
  local_1d8 = std::vector<int,_std::allocator<int>_>::operator[](&local_1b8,0);
  local_1dc = 0;
  local_1e0 = 0;
  local_1e4 = local_188 * in_stack_00000008 - local_17c * local_184;
  for (local_1e8 = 0; local_1e8 < local_180; local_1e8 = local_1e8 + 1) {
    for (local_1ec = 0; local_1ec < local_17c; local_1ec = local_1ec + 1) {
      local_1d8[local_1dc] = local_1e0;
      local_1dc = local_1dc + 1;
      local_1e0 = local_184 + local_1e0;
    }
    local_1e0 = local_1e4 + local_1e0;
  }
  for (local_1f0 = 0; local_1f0 < local_198; local_1f0 = local_1f0 + 1) {
    local_120 = &local_240;
    local_4c = *(int *)((long)local_170 + 0x2c);
    local_50 = (int)local_170[6];
    local_54 = *(undefined4 *)((long)local_170 + 0x34);
    local_60 = *local_170 + local_170[8] * (long)local_1f0 * local_170[2];
    local_68 = local_170[2];
    local_6c = (undefined4)local_170[3];
    local_78 = local_170[4];
    local_48 = &local_240;
    local_38 = (long)local_4c * (long)local_50 * local_68;
    local_18 = &local_240;
    local_160 = &local_240;
    local_3c = 0x10;
    local_12c = local_1f0;
    local_12d = 1;
    local_240 = 0;
    local_230 = 0;
    local_228 = 0;
    local_218 = 0;
    local_214 = 0;
    local_210 = 0;
    local_20c = 0;
    local_208 = 0;
    local_200 = 0;
    local_238 = 0;
    local_1f8 = local_60;
    for (local_244 = 0; local_244 < local_194; local_244 = local_244 + 1) {
      for (local_248 = 0; local_248 < local_190; local_248 = local_248 + 1) {
        local_24c = 0;
        local_20 = local_178;
        local_258 = *local_178 + (long)(local_19c * local_18c * local_1f0);
        for (local_25c = 0; local_25c < local_18c; local_25c = local_25c + 1) {
          local_f0 = &local_2a8;
          local_f8 = local_168;
          local_fc = local_25c;
          local_84 = *(int *)(local_168 + 0x2c);
          local_88 = *(int *)(local_168 + 0x30);
          local_8c = *(undefined4 *)(local_168 + 0x34);
          local_98 = *(long *)local_168 +
                     *(long *)(local_168 + 0x40) * (long)local_25c * *(long *)(local_168 + 0x10);
          local_a0 = *(long *)(local_168 + 0x10);
          local_a4 = *(undefined4 *)(local_168 + 0x18);
          local_b0 = *(long *)(local_168 + 0x20);
          local_80 = &local_2a8;
          local_28 = (long)local_84 * (long)local_88 * local_a0;
          local_2c = 0x10;
          local_fd = 1;
          local_c = local_244 * in_stack_00000018;
          local_8 = &local_2a8;
          for (local_2b4 = 0; local_2b4 < local_19c; local_2b4 = local_2b4 + 1) {
            local_24c = (int)*(char *)(local_98 + (long)local_84 * (long)local_c * local_a0 +
                                       (long)(local_248 * in_stack_00000010) +
                                      (long)local_1d8[local_2b4]) *
                        (int)*(char *)(local_258 + local_2b4) + local_24c;
          }
          local_258 = local_258 + local_19c;
          local_158 = &local_2a8;
          local_2a8 = 0;
          local_298 = 0;
          local_290 = 0;
          local_280 = 0;
          local_27c = 0;
          local_278 = 0;
          local_274 = 0;
          local_270 = 0;
          local_268 = 0;
          local_2a0 = 0;
          in_stack_fffffffffffffd00 = local_168;
          local_148 = local_158;
          local_288 = local_b0;
        }
        *(int *)(local_1f8 + (long)local_248 * 4) = local_24c;
      }
      local_1f8 = local_1f8 + (long)local_190 * 4;
    }
    local_138 = local_160;
    local_220 = local_78;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd00);
  return;
}

Assistant:

static void convolution_int8(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_int8, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, const Option& opt)
{
    int w = bottom_blob.w;
    int channels = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        int* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                int sum = 0;

                //                 const signed char* kptr = weight_data_int8.channel(p);
                const signed char* kptr = (const signed char*)weight_data_int8 + maxk * channels * p;

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    const signed char* sptr = m.row<signed char>(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        signed char val = sptr[space_ofs[k]];
                        signed char w = kptr[k];
                        sum += val * w;
                    }

                    kptr += maxk;
                }

                outptr[j] = sum;
            }

            outptr += outw;
        }
    }
}